

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void Assimp::FBX::ResolveVertexDataArray<aiVector2t<float>>
               (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  uint uVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Element *pEVar10;
  pointer piVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  string *psVar15;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_22a;
  allocator<char> local_229;
  string local_228;
  string local_208;
  _Vector_base<int,_std::allocator<int>_> local_1e8;
  char *local_1c8;
  char *local_1c0;
  string *local_1b8;
  string *local_1b0;
  format local_1a8;
  
  local_1c8 = dataElementName;
  local_1b0 = MappingInformationType;
  bVar6 = std::operator==(ReferenceInformationType,"Direct");
  bVar7 = std::operator==(ReferenceInformationType,"IndexToDirect");
  local_1c0 = indexDataElementName;
  local_1b8 = ReferenceInformationType;
  if (bVar7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,indexDataElementName,(allocator<char> *)&local_228);
    bVar8 = HasElement(source,(string *)&local_1a8);
    bVar8 = !bVar8;
    std::__cxx11::string::~string((string *)&local_1a8);
    bVar7 = bVar8;
  }
  else {
    bVar7 = true;
    bVar8 = false;
  }
  psVar15 = local_1b0;
  bVar9 = std::operator==(local_1b0,"ByVertice");
  pcVar5 = local_1c8;
  if (((bVar6 | bVar8) == 1) && (bVar9)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_228);
    bVar6 = HasElement(source,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (!bVar6) {
      return;
    }
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar5,(allocator<char> *)&local_208);
    pEVar10 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_228,pEVar10)
    ;
    std::__cxx11::string::~string((string *)&local_1a8);
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              (data_out,vertex_count);
    for (lVar12 = 0;
        lVar12 != (long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 3;
        lVar12 = lVar12 + 1) {
      uVar13 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar12];
      uVar1 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[lVar12];
      for (uVar14 = (ulong)uVar13; uVar14 < uVar1 + uVar13; uVar14 = uVar14 + 1) {
        (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start
        [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar14]] =
             *(aiVector2t<float> *)(local_228._M_dataplus._M_p + lVar12 * 8);
      }
    }
LAB_0052dac0:
    psVar15 = &local_228;
  }
  else {
    bVar9 = std::operator==(psVar15,"ByVertice");
    if (bVar9 && !bVar7) {
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_228);
      pEVar10 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray
                ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_208,
                 pEVar10);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_1e8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1c0,(allocator<char> *)&local_228);
      pEVar10 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray((vector<int,_std::allocator<int>_> *)&local_1e8,pEVar10);
      std::__cxx11::string::~string((string *)&local_1a8);
      for (lVar12 = 0;
          lVar12 != (long)local_1e8._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e8._M_impl.super__Vector_impl_data._M_start >> 2;
          lVar12 = lVar12 + 1) {
        uVar13 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar12];
        uVar1 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar12];
        for (uVar14 = (ulong)uVar13; uVar14 < uVar1 + uVar13; uVar14 = uVar14 + 1) {
          if ((ulong)((long)(local_208._M_string_length - (long)local_208._M_dataplus._M_p) >> 3) <=
              (ulong)(long)local_1e8._M_impl.super__Vector_impl_data._M_start[lVar12]) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,"index out of range",&local_229);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,local_1c0,&local_22a);
            pEVar10 = GetRequiredElement(source,&local_228,(Element *)0x0);
            Util::DOMError((string *)&local_1a8,pEVar10);
          }
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start
          [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar14]] =
               *(aiVector2t<float> *)
                (local_208._M_dataplus._M_p +
                (long)local_1e8._M_impl.super__Vector_impl_data._M_start[lVar12] * 8);
        }
      }
    }
    else {
      bVar9 = std::operator==(psVar15,"ByPolygonVertex");
      if (((bVar6 | bVar8) & bVar9) == 1) {
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_208);
        pEVar10 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_228,
                   pEVar10);
        std::__cxx11::string::~string((string *)&local_1a8);
        if ((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 3 ==
            vertex_count) {
          paVar2 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.field_2._M_allocated_capacity;
          paVar3 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar4 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_dataplus._M_p;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._M_string_length;
          local_228._M_dataplus._M_p = (pointer)paVar3;
          local_228._M_string_length = (size_type)paVar4;
          local_228.field_2._M_allocated_capacity = (size_type)paVar2;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    (&local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::operator<<((ostream *)&local_1a8,", expected ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        }
        goto LAB_0052dac0;
      }
      bVar6 = std::operator==(psVar15,"ByPolygonVertex");
      if (bVar7 || !bVar6) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_1a8,
                   (char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::operator<<((ostream *)&local_1a8,(string *)psVar15);
        std::operator<<((ostream *)&local_1a8,",");
        std::operator<<((ostream *)&local_1a8,(string *)local_1b8);
        LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        return;
      }
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1c8,(allocator<char> *)&local_228);
      pEVar10 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      pcVar5 = local_1c0;
      ParseVectorDataArray
                ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_208,
                 pEVar10);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_1e8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar5,(allocator<char> *)&local_228);
      pEVar10 = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
      ParseVectorDataArray((vector<int,_std::allocator<int>_> *)&local_1e8,pEVar10);
      std::__cxx11::string::~string((string *)&local_1a8);
      if ((long)local_1e8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1e8._M_impl.super__Vector_impl_data._M_start >> 2 == vertex_count) {
        uVar13 = 0;
        for (piVar11 = local_1e8._M_impl.super__Vector_impl_data._M_start;
            piVar11 != local_1e8._M_impl.super__Vector_impl_data._M_finish; piVar11 = piVar11 + 1) {
          uVar14 = (ulong)*piVar11;
          if (uVar14 == 0xffffffffffffffff) {
            paVar2 = (data_out->
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar13;
            paVar2->x = 0.0;
            paVar2->y = 0.0;
          }
          else {
            if ((ulong)((long)(local_208._M_string_length - (long)local_208._M_dataplus._M_p) >> 3)
                <= uVar14) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a8,"index out of range",&local_229);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_228,pcVar5,&local_22a);
              pEVar10 = GetRequiredElement(source,&local_228,(Element *)0x0);
              Util::DOMError((string *)&local_1a8,pEVar10);
            }
            (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar13] =
                 *(aiVector2t<float> *)(local_208._M_dataplus._M_p + uVar14 * 8);
          }
          uVar13 = uVar13 + 1;
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x52dad3);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1e8);
    psVar15 = &local_208;
  }
  std::_Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~_Vector_base
            ((_Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)psVar15);
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}